

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O0

void __thiscall
cmCustomCommand::cmCustomCommand
          (cmCustomCommand *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *byproducts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmCustomCommandLines *commandLines,char *comment,char *workingDirectory)

{
  Snapshot snapshot;
  char *local_138;
  char *local_118;
  cmListFileBacktrace local_d0;
  allocator local_8a;
  allocator local_89;
  cmCommandContext local_88;
  Snapshot local_60;
  cmCustomCommandLines *local_38;
  cmCustomCommandLines *commandLines_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_local;
  cmMakefile *mf_local;
  cmCustomCommand *this_local;
  
  local_38 = commandLines;
  commandLines_local = (cmCustomCommandLines *)depends;
  depends_local = byproducts;
  byproducts_local = outputs;
  outputs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)mf;
  mf_local = (cmMakefile *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs,outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts,depends_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)commandLines_local);
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines,local_38);
  cmState::Snapshot::Snapshot(&local_60,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_88);
  snapshot.Position.Tree = local_60.Position.Tree;
  snapshot.State = local_60.State;
  snapshot.Position.Position = local_60.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_88);
  cmCommandContext::~cmCommandContext(&local_88);
  ImplicitDependsList::ImplicitDependsList(&this->ImplicitDepends);
  if (comment == (char *)0x0) {
    local_118 = "";
  }
  else {
    local_118 = comment;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Comment,local_118,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  if (workingDirectory == (char *)0x0) {
    local_138 = "";
  }
  else {
    local_138 = workingDirectory;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->WorkingDirectory,local_138,&local_8a);
  std::allocator<char>::~allocator((allocator<char> *)&local_8a);
  this->HaveComment = (bool)(-(comment != (char *)0x0) & 1);
  this->EscapeAllowMakeVars = false;
  this->EscapeOldStyle = true;
  if (outputs_local !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    cmMakefile::GetBacktrace(&local_d0,(cmMakefile *)outputs_local);
    cmListFileBacktrace::operator=(&this->Backtrace,&local_d0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_d0);
  }
  return;
}

Assistant:

cmCustomCommand::cmCustomCommand(cmMakefile const* mf,
                                 const std::vector<std::string>& outputs,
                                 const std::vector<std::string>& byproducts,
                                 const std::vector<std::string>& depends,
                                 const cmCustomCommandLines& commandLines,
                                 const char* comment,
                                 const char* workingDirectory):
  Outputs(outputs),
  Byproducts(byproducts),
  Depends(depends),
  CommandLines(commandLines),
  Backtrace(),
  Comment(comment?comment:""),
  WorkingDirectory(workingDirectory?workingDirectory:""),
  HaveComment(comment?true:false),
  EscapeAllowMakeVars(false),
  EscapeOldStyle(true)
{
  if(mf)
    {
    this->Backtrace = mf->GetBacktrace();
    }
}